

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

TProb Cipher::calcScore(TParameters *params,TFreqMap *freqMap,
                       vector<int,_std::allocator<int>_> *plain,
                       vector<float,_std::allocator<float>_> *memo)

{
  pointer piVar1;
  _Hash_node_base *p_Var2;
  float fVar3;
  long lVar4;
  TProb *pTVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  float fVar13;
  array<int,_28UL> letCount;
  uint local_cc;
  float local_c8;
  float local_c4;
  TParameters *local_c0;
  _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  int local_a8 [30];
  
  piVar1 = (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar8 = (ulong)((long)(plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_c8 = 0.0;
  fVar13 = 0.0;
  uVar7 = (uint)uVar8;
  if (0 < (int)uVar7) {
    uVar6 = 0;
    iVar9 = 0;
    do {
      uVar10 = (ulong)(uint)piVar1[uVar6];
      if (uVar10 < 0x1c) {
        local_a8[uVar10] = local_a8[uVar10] + 1;
        iVar9 = iVar9 + 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar6);
    fVar13 = (float)iVar9;
  }
  local_b8 = (_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&freqMap->prob;
  lVar4 = 0;
  do {
    fVar3 = *(float *)((long)&(anonymous_namespace)::kEnglishLetterWithSpacesFreq + lVar4) * 0.01 -
            (float)*(int *)((long)local_a8 + lVar4) / fVar13;
    local_c8 = local_c8 + fVar3 * fVar3;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x70);
  local_c8 = local_c8 / 28.0;
  local_b0 = plain;
  if (local_c8 < 0.0) {
    local_c8 = sqrtf(local_c8);
  }
  else {
    local_c8 = SQRT(local_c8);
  }
  iVar9 = freqMap->len;
  local_cc = 0;
  if ((long)iVar9 < 1) {
    uVar6 = 0;
  }
  else {
    local_cc = 0;
    uVar6 = 0;
    uVar10 = 0;
    if (0 < (int)uVar7) {
      uVar10 = uVar8 & 0xffffffff;
    }
    do {
      if (uVar10 == uVar6) {
        return -INFINITY;
      }
      local_cc = local_cc * 0x20 +
                 (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
    } while ((long)iVar9 != uVar6);
  }
  lVar4 = (long)(int)uVar6 + -1;
  local_c0 = params;
  if (0.5 < (memo->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start[(long)(int)uVar6 + -1]) {
    uVar8 = (freqMap->prob)._M_h._M_bucket_count;
    uVar10 = (ulong)(long)(int)local_cc % uVar8;
    p_Var11 = (freqMap->prob)._M_h._M_buckets[uVar10];
    p_Var12 = (__node_base_ptr)0x0;
    if ((p_Var11 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var11->_M_nxt, p_Var12 = p_Var11, local_cc != *(uint *)&p_Var11->_M_nxt[1]._M_nxt
       )) {
      while (p_Var11 = p_Var2, p_Var2 = p_Var11->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var12 = (__node_base_ptr)0x0;
        if (((ulong)(long)(int)*(uint *)&p_Var2[1]._M_nxt % uVar8 != uVar10) ||
           (p_Var12 = p_Var11, local_cc == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_00142fe6;
      }
      p_Var12 = (__node_base_ptr)0x0;
    }
LAB_00142fe6:
    if ((p_Var12 == (__node_base_ptr)0x0) || (p_Var12->_M_nxt == (_Hash_node_base *)0x0)) {
      pTVar5 = &freqMap->pmin;
    }
    else {
      pTVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at(local_b8,(key_type *)&local_cc);
    }
    (memo->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = *pTVar5;
  }
  local_c4 = (memo->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar4] + 0.0;
  uVar6 = uVar6 & 0xffffffff;
  do {
    uVar8 = (long)(int)((local_cc & ~(-1 << ((char)iVar9 * '\x05' - 5U & 0x1f))) << 5) +
            (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
    local_cc = (uint)uVar8;
    if (0.5 < (memo->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6]) {
      uVar10 = (freqMap->prob)._M_h._M_bucket_count;
      uVar8 = uVar8 % uVar10;
      p_Var11 = (freqMap->prob)._M_h._M_buckets[uVar8];
      p_Var12 = (__node_base_ptr)0x0;
      if ((p_Var11 != (__node_base_ptr)0x0) &&
         (p_Var2 = p_Var11->_M_nxt, p_Var12 = p_Var11,
         local_cc != *(uint *)&p_Var11->_M_nxt[1]._M_nxt)) {
        while (p_Var11 = p_Var2, p_Var2 = p_Var11->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
          p_Var12 = (__node_base_ptr)0x0;
          if (((ulong)(long)(int)*(uint *)&p_Var2[1]._M_nxt % uVar10 != uVar8) ||
             (p_Var12 = p_Var11, local_cc == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_001430c5;
        }
        p_Var12 = (__node_base_ptr)0x0;
      }
LAB_001430c5:
      pTVar5 = &freqMap->pmin;
      if ((p_Var12 != (__node_base_ptr)0x0) && (p_Var12->_M_nxt != (_Hash_node_base *)0x0)) {
        pTVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at(local_b8,(key_type *)&local_cc);
      }
      (memo->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = *pTVar5;
    }
    local_c4 = local_c4 +
               (memo->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6];
    uVar6 = uVar6 + 1;
    if ((int)uVar7 <= (int)uVar6) {
      return local_c4 / (float)(int)uVar7 - local_c8 * local_c0->wEnglishFreq;
    }
  } while( true );
}

Assistant:

TProb calcScore(
            const TParameters & params,
            const TFreqMap & freqMap,
            const std::vector<TLetter> & plain,
                  std::vector<TProb> & memo) {
        TProb res = 0.0;

        const int n = plain.size();
        const auto & len  = freqMap.len;
        const auto & prob = freqMap.prob;

        int nlet = 0;
        std::array<int, 28> letCount;
        letCount.fill(0);
        for (int i = 0; i < n; ++i) {
            if (plain[i] >= 0 && plain[i] <= 27) {
                ++letCount[plain[i]];
                ++nlet;
            }
        }

        float letFreqCost = 0.0;
        {
            auto & freq = kEnglishLetterWithSpacesFreq;
            for (int i = 0; i <= 27; ++i) {
                float curf = 0.01*freq[i] - ((float)(letCount[i]))/((float)(nlet));
                letFreqCost += curf*curf;
            }
        }

        letFreqCost /= 28.0;
        letFreqCost = sqrt(letFreqCost);

        int i1 = 0;
        int k = len;
        TCode curc = 0;
        TCode mask = (1 << 5*(len-1)) - 1;

        while (k > 0) {
            if (i1 >= n) return -1e100;
            auto c = plain[i1++];
            curc <<= 5;
            curc += c;
            --k;
        }

        if (memo[i1 - 1] > 0.5) {
            memo[i1 - 1] = prob.find(curc) == prob.end() ? freqMap.pmin : prob.at(curc);
        }
        res += memo[i1 - 1];

        while (true) {
            curc &= mask;

            auto c = plain[i1++];
            curc <<= 5;
            curc += c;

            if (memo[i1 - 1] > 0.5) {
                memo[i1 - 1] = prob.find(curc) == prob.end() ? freqMap.pmin : prob.at(curc);
            }
            res += memo[i1 - 1];

            if (i1 >= n) break;
        }

        return res/n - params.wEnglishFreq*letFreqCost;
    }